

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

SystemMillisRange * QLocalTime::computeSystemMillisRange(void)

{
  int iVar1;
  time_t tVar2;
  tm *in_RDI;
  long in_FS_OFFSET;
  anon_struct_16_2_491a6482 *__end2_1;
  anon_struct_16_2_491a6482 *__begin2_1;
  anon_struct_16_2_491a6482 (*__range2_1) [5];
  bool startMin;
  anon_struct_16_2_491a6482 *__end2;
  anon_struct_16_2_491a6482 *__begin2;
  anon_struct_16_2_491a6482 (*__range2) [2];
  bool stopMax;
  qint64 stop;
  bool isNarrow;
  qint64 TIME_T_MAX;
  tm local_res70;
  anon_struct_16_2_491a6482 c_1;
  tm local;
  anon_struct_16_2_491a6482 c;
  anon_struct_16_2_491a6482 ends [2];
  anon_struct_16_2_491a6482 starts [5];
  tm *when;
  long *local_158;
  bool local_141;
  long *local_138;
  bool local_121;
  long local_120;
  undefined1 local_108 [12];
  undefined4 local_fc;
  undefined4 local_f8;
  int local_f4;
  undefined4 local_e8;
  long local_d0;
  long local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  int local_ac;
  undefined4 local_a0;
  long local_88;
  long local_80;
  long local_78 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  when = in_RDI;
  memcpy(local_78 + 4,&DAT_001d0040,0x50);
  local_78[0] = 0x116bd2d1;
  local_78[1] = 0x7fffffffffffffff;
  local_78[2] = 3000;
  local_78[3] = 0x1d9731fe0bff;
  iVar1 = std::numeric_limits<int>::max();
  local_120 = (long)iVar1 * 1000 + 999;
  local_121 = true;
  for (local_138 = local_78; local_138 != local_78 + 4; local_138 = local_138 + 2) {
    local_88 = *local_138;
    local_80 = local_138[1];
    memset(&local_c0,0,0x38);
    local_ac = anon_unknown.dwarf_31369b::tmYearFromQYear((int)local_88);
    local_b0 = 0xb;
    local_b4 = 0x1f;
    local_b8 = 0x17;
    local_c0 = 0x3b;
    local_bc = 0x3b;
    local_a0 = 0xffffffff;
    tVar2 = qMkTime(when);
    if (tVar2 != -1) {
      local_120 = local_80;
      break;
    }
    local_121 = false;
  }
  local_141 = true;
  local_158 = local_78 + 4;
  do {
    if (local_158 == &local_8) {
      when->tm_sec = 0;
      when->tm_min = 0;
      *(long *)&when->tm_hour = local_120;
      *(bool *)&when->tm_mon = false;
      *(bool *)((long)&when->tm_mon + 1) = local_121;
LAB_001729f1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (SystemMillisRange *)in_RDI;
      }
      __stack_chk_fail();
    }
    local_d0 = *local_158;
    local_c8 = local_158[1];
    memset(local_108,0,0x38);
    local_f4 = anon_unknown.dwarf_31369b::tmYearFromQYear((int)local_d0);
    local_f8 = 1;
    local_fc = 1;
    local_e8 = 0xffffffff;
    tVar2 = qMkTime(when);
    if (tVar2 != -1) {
      when->tm_sec = (undefined4)local_c8;
      when->tm_min = local_c8._4_4_;
      *(long *)&when->tm_hour = local_120;
      *(bool *)&when->tm_mon = local_141;
      *(bool *)((long)&when->tm_mon + 1) = local_121;
      goto LAB_001729f1;
    }
    local_141 = false;
    local_158 = local_158 + 2;
  } while( true );
}

Assistant:

SystemMillisRange computeSystemMillisRange()
{
    // Assert this here, as this is called just once, in a static initialization.
    Q_ASSERT(QGregorianCalendar::julianFromParts(1970, 1, 1) == JULIAN_DAY_FOR_EPOCH);

    constexpr qint64 TIME_T_MAX = std::numeric_limits<time_t>::max();
    using Bounds = std::numeric_limits<qint64>;
    constexpr bool isNarrow = Bounds::max() / MSECS_PER_SEC > TIME_T_MAX;
    if constexpr (isNarrow) {
        const qint64 msecsMax = quint64(TIME_T_MAX) * MSECS_PER_SEC - 1 + MSECS_PER_SEC;
        const qint64 msecsMin = -1 - msecsMax; // TIME_T_MIN is -1 - TIME_T_MAX
        // If we reach back to msecsMin, use it; otherwise, assume 1970 cut-off (MS).
        struct tm local = {};
        local.tm_year = tmYearFromQYear(1901);
        local.tm_mon = 11;
        local.tm_mday = 15; // A day and a bit after the start of 32-bit time_t:
        local.tm_isdst = -1;
        return {qMkTime(&local) == -1 ? 0 : msecsMin, msecsMax, false, false};
    } else {
        const struct { int year; qint64 millis; } starts[] = {
            { int(QDateTime::YearRange::First) + 1, Bounds::min() },
            // Beginning of the Common Era:
            { 1, -Q_INT64_C(62135596800000) },
            // Invention of the Gregorian calendar:
            { 1582, -Q_INT64_C(12244089600000) },
            // Its adoption by the anglophone world:
            { 1752, -Q_INT64_C(6879427200000) },
            // Before this, struct tm's tm_year is negative (Darwin):
            { 1900, -Q_INT64_C(2208988800000) },
        }, ends[] = {
            { int(QDateTime::YearRange::Last) - 1, Bounds::max() },
            // MS's end-of-range, end of year 3000:
            { 3000, Q_INT64_C(32535215999999) },
        };
        // Assume we do at least reach the end of a signed 32-bit time_t (since
        // our actual time_t is bigger than that):
        qint64 stop =
            quint64(std::numeric_limits<qint32>::max()) * MSECS_PER_SEC - 1 + MSECS_PER_SEC;
        // Cleared if first pass round loop fails:
        bool stopMax = true;
        for (const auto c : ends) {
            struct tm local = {};
            local.tm_year = tmYearFromQYear(c.year);
            local.tm_mon = 11;
            local.tm_mday = 31;
            local.tm_hour = 23;
            local.tm_min = local.tm_sec = 59;
            local.tm_isdst = -1;
            if (qMkTime(&local) != -1) {
                stop = c.millis;
                break;
            }
            stopMax = false;
        }
        bool startMin = true;
        for (const auto c : starts) {
            struct tm local {};
            local.tm_year = tmYearFromQYear(c.year);
            local.tm_mon = 1;
            local.tm_mday = 1;
            local.tm_isdst = -1;
            if (qMkTime(&local) != -1)
                return {c.millis, stop, startMin, stopMax};
            startMin = false;
        }
        return {0, stop, false, stopMax};
    }
}